

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double orient4dexact(double *pa,double *pb,double *pc,double *pd,double *pe,double aheight,
                    double bheight,double cheight,double dheight,double eheight)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int elen;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double ce [4];
  double bd [4];
  double ab [4];
  double eb [4];
  double da [4];
  double ea [4];
  double de [4];
  double cd [4];
  double ac [4];
  double bc [4];
  double temp48b [48];
  double temp48a [48];
  double eac [24];
  double cda [24];
  double bce [24];
  double abd [24];
  double eab [24];
  double dea [24];
  double cde [24];
  double bcd [24];
  double abc [24];
  double temp8b [8];
  double temp8a [8];
  double deb [24];
  double temp16 [16];
  double ddet [192];
  double cdet [192];
  double bdet [192];
  double adet [192];
  double eabc [96];
  double deab [96];
  double cdea [96];
  double bcde [96];
  double abcd [96];
  double edet [192];
  double cddet [384];
  double abdet [384];
  double deter [960];
  double cdedet [576];
  double local_81f8;
  double local_81f0;
  double local_81e8;
  double local_81e0;
  double local_81d8;
  double local_81d0;
  double local_81c8;
  double local_81c0;
  double local_81b8;
  double local_81b0;
  double local_81a8;
  double local_81a0;
  double local_8198;
  double local_8190;
  double local_8188;
  double local_8180;
  double local_8178;
  double local_8170;
  double local_8168;
  double local_8160;
  double local_8158;
  double local_8150;
  double local_8148;
  double local_8140;
  double local_8138;
  double local_8130;
  double local_8128;
  double local_8120;
  double local_8118;
  double local_8110;
  double local_8108;
  double local_8100;
  double local_80f8;
  double local_80f0;
  double local_80e8;
  double local_80e0;
  double local_80d8;
  double local_80d0;
  double local_80c8;
  double local_80c0;
  double local_80b8 [48];
  double local_7f38 [48];
  double local_7db8 [24];
  double local_7cf8 [24];
  double local_7c38 [24];
  double local_7b78 [24];
  double local_7ab8 [24];
  double local_79f8 [24];
  double local_7938 [24];
  double local_7878 [24];
  double local_77b8 [24];
  double local_76f8 [8];
  double local_76b8 [8];
  double local_7678 [24];
  double local_75b8 [16];
  double local_7538 [192];
  double local_6f38 [192];
  double local_6938 [192];
  double local_6338 [192];
  double local_5d38 [96];
  double local_5a38 [96];
  double local_5738 [96];
  double local_5438 [96];
  double local_5138 [96];
  double local_4e38 [192];
  double local_4838 [384];
  double local_3c38 [383];
  double adStack_3040 [961];
  double local_1238 [577];
  
  dVar48 = *pb;
  dVar36 = pb[1];
  dVar32 = *pa;
  dVar1 = dVar32 * dVar36;
  dVar26 = dVar32 * splitter - (dVar32 * splitter - dVar32);
  dVar37 = dVar32 - dVar26;
  dVar20 = dVar36 * splitter - (dVar36 * splitter - dVar36);
  dVar45 = dVar36 - dVar20;
  dVar15 = dVar37 * dVar45 - (((dVar1 - dVar26 * dVar20) - dVar37 * dVar20) - dVar26 * dVar45);
  dVar21 = splitter * dVar48 - (splitter * dVar48 - dVar48);
  dVar44 = pa[1];
  dVar42 = splitter * dVar44 - (splitter * dVar44 - dVar44);
  dVar17 = dVar48 * dVar44;
  dVar38 = dVar48 - dVar21;
  dVar33 = dVar44 - dVar42;
  dVar22 = dVar38 * dVar33 - (((dVar17 - dVar21 * dVar42) - dVar38 * dVar42) - dVar21 * dVar33);
  dVar27 = dVar15 - dVar22;
  local_81b8 = (dVar15 - (dVar27 + (dVar15 - dVar27))) + ((dVar15 - dVar27) - dVar22);
  dVar15 = dVar1 + dVar27;
  dVar1 = (dVar1 - (dVar15 - (dVar15 - dVar1))) + (dVar27 - (dVar15 - dVar1));
  dVar22 = dVar1 - dVar17;
  local_81b0 = (dVar1 - (dVar22 + (dVar1 - dVar22))) + ((dVar1 - dVar22) - dVar17);
  local_81a0 = dVar15 + dVar22;
  local_81a8 = (dVar15 - (local_81a0 - (local_81a0 - dVar15))) + (dVar22 - (local_81a0 - dVar15));
  dVar1 = pc[1];
  dVar43 = splitter * dVar1 - (splitter * dVar1 - dVar1);
  dVar17 = dVar48 * dVar1;
  dVar46 = dVar1 - dVar43;
  dVar27 = dVar38 * dVar46 - (((dVar17 - dVar21 * dVar43) - dVar38 * dVar43) - dVar21 * dVar46);
  dVar15 = *pc;
  dVar34 = splitter * dVar15 - (splitter * dVar15 - dVar15);
  dVar22 = dVar36 * dVar15;
  dVar39 = dVar15 - dVar34;
  dVar23 = dVar39 * dVar45 - (((dVar22 - dVar34 * dVar20) - dVar39 * dVar20) - dVar34 * dVar45);
  dVar28 = dVar27 - dVar23;
  local_80d8 = (dVar27 - (dVar28 + (dVar27 - dVar28))) + ((dVar27 - dVar28) - dVar23);
  dVar27 = dVar17 + dVar28;
  dVar17 = (dVar17 - (dVar27 - (dVar27 - dVar17))) + (dVar28 - (dVar27 - dVar17));
  dVar23 = dVar17 - dVar22;
  local_80d0 = (dVar17 - (dVar23 + (dVar17 - dVar23))) + ((dVar17 - dVar23) - dVar22);
  local_80c0 = dVar27 + dVar23;
  local_80c8 = (dVar27 - (local_80c0 - (local_80c0 - dVar27))) + (dVar23 - (local_80c0 - dVar27));
  dVar17 = pd[1];
  dVar18 = splitter * dVar17 - (splitter * dVar17 - dVar17);
  dVar27 = dVar15 * dVar17;
  dVar29 = dVar17 - dVar18;
  dVar28 = dVar39 * dVar29 - (((dVar27 - dVar34 * dVar18) - dVar39 * dVar18) - dVar34 * dVar29);
  dVar22 = *pd;
  dVar35 = splitter * dVar22 - (splitter * dVar22 - dVar22);
  dVar23 = dVar1 * dVar22;
  dVar40 = dVar22 - dVar35;
  dVar24 = dVar40 * dVar46 - (((dVar23 - dVar35 * dVar43) - dVar40 * dVar43) - dVar35 * dVar46);
  dVar30 = dVar28 - dVar24;
  local_8118 = (dVar28 - (dVar30 + (dVar28 - dVar30))) + ((dVar28 - dVar30) - dVar24);
  dVar28 = dVar27 + dVar30;
  dVar27 = (dVar27 - (dVar28 - (dVar28 - dVar27))) + (dVar30 - (dVar28 - dVar27));
  dVar24 = dVar27 - dVar23;
  local_8110 = (dVar27 - (dVar24 + (dVar27 - dVar24))) + ((dVar27 - dVar24) - dVar23);
  local_8100 = dVar28 + dVar24;
  local_8108 = (dVar28 - (local_8100 - (local_8100 - dVar28))) + (dVar24 - (local_8100 - dVar28));
  dVar27 = pe[1];
  dVar30 = splitter * dVar27 - (splitter * dVar27 - dVar27);
  dVar28 = dVar36 * dVar22;
  dVar49 = dVar44 * dVar22;
  dVar22 = dVar22 * dVar27;
  dVar41 = dVar32 * dVar27;
  dVar31 = dVar44 * dVar15;
  dVar15 = dVar15 * dVar27;
  dVar16 = dVar48 * dVar27;
  dVar27 = dVar27 - dVar30;
  dVar24 = dVar40 * dVar27 - (((dVar22 - dVar35 * dVar30) - dVar40 * dVar30) - dVar35 * dVar27);
  dVar23 = *pe;
  dVar47 = splitter * dVar23 - (splitter * dVar23 - dVar23);
  dVar48 = dVar48 * dVar17;
  dVar19 = dVar32 * dVar17;
  dVar17 = dVar17 * dVar23;
  dVar44 = dVar44 * dVar23;
  dVar32 = dVar32 * dVar1;
  dVar1 = dVar1 * dVar23;
  dVar36 = dVar36 * dVar23;
  dVar23 = dVar23 - dVar47;
  dVar50 = dVar23 * dVar29 - (((dVar17 - dVar47 * dVar18) - dVar23 * dVar18) - dVar47 * dVar29);
  dVar25 = dVar24 - dVar50;
  local_8138 = (dVar24 - (dVar25 + (dVar24 - dVar25))) + ((dVar24 - dVar25) - dVar50);
  dVar24 = dVar22 + dVar25;
  dVar25 = (dVar22 - (dVar24 - (dVar24 - dVar22))) + (dVar25 - (dVar24 - dVar22));
  dVar22 = dVar25 - dVar17;
  local_8130 = (dVar25 - (dVar22 + (dVar25 - dVar22))) + ((dVar25 - dVar22) - dVar17);
  local_8120 = dVar24 + dVar22;
  local_8128 = (dVar24 - (local_8120 - (local_8120 - dVar24))) + (dVar22 - (local_8120 - dVar24));
  dVar17 = dVar23 * dVar33 - (((dVar44 - dVar47 * dVar42) - dVar23 * dVar42) - dVar47 * dVar33);
  dVar22 = dVar37 * dVar27 - (((dVar41 - dVar26 * dVar30) - dVar37 * dVar30) - dVar26 * dVar27);
  dVar24 = dVar17 - dVar22;
  local_8158 = (dVar17 - (dVar24 + (dVar17 - dVar24))) + ((dVar17 - dVar24) - dVar22);
  dVar17 = dVar44 + dVar24;
  dVar22 = (dVar44 - (dVar17 - (dVar17 - dVar44))) + (dVar24 - (dVar17 - dVar44));
  dVar44 = dVar22 - dVar41;
  local_8150 = (dVar22 - (dVar44 + (dVar22 - dVar44))) + ((dVar22 - dVar44) - dVar41);
  local_8140 = dVar17 + dVar44;
  local_8148 = (dVar17 - (local_8140 - (local_8140 - dVar17))) + (dVar44 - (local_8140 - dVar17));
  dVar17 = dVar37 * dVar46 - (((dVar32 - dVar26 * dVar43) - dVar37 * dVar43) - dVar26 * dVar46);
  dVar44 = dVar39 * dVar33 - (((dVar31 - dVar34 * dVar42) - dVar39 * dVar42) - dVar34 * dVar33);
  dVar22 = dVar17 - dVar44;
  local_80f8 = (dVar17 - (dVar22 + (dVar17 - dVar22))) + ((dVar17 - dVar22) - dVar44);
  dVar44 = dVar32 + dVar22;
  dVar17 = (dVar32 - (dVar44 - (dVar44 - dVar32))) + (dVar22 - (dVar44 - dVar32));
  dVar32 = dVar17 - dVar31;
  local_80f0 = (dVar17 - (dVar32 + (dVar17 - dVar32))) + ((dVar17 - dVar32) - dVar31);
  local_80e0 = dVar44 + dVar32;
  local_80e8 = (dVar44 - (local_80e0 - (local_80e0 - dVar44))) + (dVar32 - (local_80e0 - dVar44));
  dVar17 = dVar38 * dVar29 - (((dVar48 - dVar21 * dVar18) - dVar38 * dVar18) - dVar21 * dVar29);
  dVar32 = dVar40 * dVar45 - (((dVar28 - dVar35 * dVar20) - dVar40 * dVar20) - dVar35 * dVar45);
  dVar44 = dVar17 - dVar32;
  local_81d8 = (dVar17 - (dVar44 + (dVar17 - dVar44))) + ((dVar17 - dVar44) - dVar32);
  dVar32 = dVar48 + dVar44;
  dVar44 = (dVar48 - (dVar32 - (dVar32 - dVar48))) + (dVar44 - (dVar32 - dVar48));
  dVar48 = dVar44 - dVar28;
  local_81d0 = (dVar44 - (dVar48 + (dVar44 - dVar48))) + ((dVar44 - dVar48) - dVar28);
  local_81c0 = dVar32 + dVar48;
  local_81c8 = (dVar32 - (local_81c0 - (local_81c0 - dVar32))) + (dVar48 - (local_81c0 - dVar32));
  dVar44 = dVar39 * dVar27 - (((dVar15 - dVar34 * dVar30) - dVar39 * dVar30) - dVar34 * dVar27);
  dVar32 = dVar46 * dVar23 - (((dVar1 - dVar47 * dVar43) - dVar43 * dVar23) - dVar47 * dVar46);
  dVar48 = dVar44 - dVar32;
  local_81f8 = (dVar44 - (dVar48 + (dVar44 - dVar48))) + ((dVar44 - dVar48) - dVar32);
  dVar44 = dVar15 + dVar48;
  dVar32 = (dVar15 - (dVar44 - (dVar44 - dVar15))) + (dVar48 - (dVar44 - dVar15));
  dVar48 = dVar32 - dVar1;
  local_81f0 = (dVar32 - (dVar48 + (dVar32 - dVar48))) + ((dVar32 - dVar48) - dVar1);
  local_81e0 = dVar44 + dVar48;
  local_81e8 = (dVar44 - (local_81e0 - (local_81e0 - dVar44))) + (dVar48 - (local_81e0 - dVar44));
  dVar32 = dVar40 * dVar33 - (((dVar49 - dVar35 * dVar42) - dVar42 * dVar40) - dVar35 * dVar33);
  dVar44 = dVar29 * dVar37 - (((dVar19 - dVar26 * dVar18) - dVar18 * dVar37) - dVar26 * dVar29);
  dVar48 = dVar32 - dVar44;
  local_8178 = (dVar32 - (dVar48 + (dVar32 - dVar48))) + ((dVar32 - dVar48) - dVar44);
  dVar32 = dVar49 + dVar48;
  dVar44 = (dVar49 - (dVar32 - (dVar32 - dVar49))) + (dVar48 - (dVar32 - dVar49));
  dVar48 = dVar44 - dVar19;
  local_8170 = (dVar44 - (dVar48 + (dVar44 - dVar48))) + ((dVar44 - dVar48) - dVar19);
  local_8160 = dVar32 + dVar48;
  local_8168 = (dVar32 - (local_8160 - (local_8160 - dVar32))) + (dVar48 - (local_8160 - dVar32));
  dVar48 = dVar23 * dVar45 - (((dVar36 - dVar47 * dVar20) - dVar20 * dVar23) - dVar47 * dVar45);
  dVar44 = dVar27 * dVar38 - (((dVar16 - dVar21 * dVar30) - dVar30 * dVar38) - dVar21 * dVar27);
  dVar32 = dVar48 - dVar44;
  local_8198 = (dVar48 - (dVar32 + (dVar48 - dVar32))) + ((dVar48 - dVar32) - dVar44);
  dVar48 = dVar36 + dVar32;
  dVar32 = (dVar36 - (dVar48 - (dVar48 - dVar36))) + (dVar32 - (dVar48 - dVar36));
  dVar36 = dVar32 - dVar16;
  local_8190 = (dVar32 - (dVar36 + (dVar32 - dVar36))) + ((dVar32 - dVar36) - dVar16);
  local_8180 = dVar48 + dVar36;
  local_8188 = (dVar48 - (local_8180 - (local_8180 - dVar48))) + (dVar36 - (local_8180 - dVar48));
  dVar48 = pa[2];
  iVar2 = scale_expansion_zeroelim(4,&local_80d8,dVar48,local_76b8);
  dVar36 = pb[2];
  iVar3 = scale_expansion_zeroelim(4,&local_80f8,-dVar36,local_76f8);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,local_76b8,iVar3,local_76f8,local_75b8);
  dVar32 = pc[2];
  iVar3 = scale_expansion_zeroelim(4,&local_81b8,dVar32,local_76b8);
  iVar2 = fast_expansion_sum_zeroelim(iVar3,local_76b8,iVar2,local_75b8,local_77b8);
  iVar3 = scale_expansion_zeroelim(4,&local_8118,dVar36,local_76b8);
  iVar4 = scale_expansion_zeroelim(4,&local_81d8,-dVar32,local_76f8);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,local_76b8,iVar4,local_76f8,local_75b8);
  dVar44 = pd[2];
  iVar4 = scale_expansion_zeroelim(4,&local_80d8,dVar44,local_76b8);
  iVar3 = fast_expansion_sum_zeroelim(iVar4,local_76b8,iVar3,local_75b8,local_7878);
  iVar4 = scale_expansion_zeroelim(4,&local_8138,dVar32,local_76b8);
  iVar5 = scale_expansion_zeroelim(4,&local_81f8,-dVar44,local_76f8);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,local_76b8,iVar5,local_76f8,local_75b8);
  dVar1 = pe[2];
  iVar5 = scale_expansion_zeroelim(4,&local_8118,dVar1,local_76b8);
  iVar4 = fast_expansion_sum_zeroelim(iVar5,local_76b8,iVar4,local_75b8,local_7938);
  iVar5 = scale_expansion_zeroelim(4,&local_8158,dVar44,local_76b8);
  iVar6 = scale_expansion_zeroelim(4,&local_8178,-dVar1,local_76f8);
  iVar5 = fast_expansion_sum_zeroelim(iVar5,local_76b8,iVar6,local_76f8,local_75b8);
  iVar6 = scale_expansion_zeroelim(4,&local_8138,dVar48,local_76b8);
  iVar5 = fast_expansion_sum_zeroelim(iVar6,local_76b8,iVar5,local_75b8,local_79f8);
  iVar6 = scale_expansion_zeroelim(4,&local_81b8,dVar1,local_76b8);
  iVar7 = scale_expansion_zeroelim(4,&local_8198,-dVar48,local_76f8);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,local_76b8,iVar7,local_76f8,local_75b8);
  iVar7 = scale_expansion_zeroelim(4,&local_8158,dVar36,local_76b8);
  iVar6 = fast_expansion_sum_zeroelim(iVar7,local_76b8,iVar6,local_75b8,local_7ab8);
  iVar7 = scale_expansion_zeroelim(4,&local_81d8,dVar48,local_76b8);
  iVar8 = scale_expansion_zeroelim(4,&local_8178,dVar36,local_76f8);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,local_76b8,iVar8,local_76f8,local_75b8);
  iVar8 = scale_expansion_zeroelim(4,&local_81b8,dVar44,local_76b8);
  iVar7 = fast_expansion_sum_zeroelim(iVar8,local_76b8,iVar7,local_75b8,local_7b78);
  iVar8 = scale_expansion_zeroelim(4,&local_81f8,dVar36,local_76b8);
  iVar9 = scale_expansion_zeroelim(4,&local_8198,dVar32,local_76f8);
  iVar8 = fast_expansion_sum_zeroelim(iVar8,local_76b8,iVar9,local_76f8,local_75b8);
  iVar9 = scale_expansion_zeroelim(4,&local_80d8,dVar1,local_76b8);
  iVar8 = fast_expansion_sum_zeroelim(iVar9,local_76b8,iVar8,local_75b8,local_7c38);
  iVar9 = scale_expansion_zeroelim(4,&local_8178,dVar32,local_76b8);
  iVar10 = scale_expansion_zeroelim(4,&local_80f8,dVar44,local_76f8);
  iVar9 = fast_expansion_sum_zeroelim(iVar9,local_76b8,iVar10,local_76f8,local_75b8);
  iVar10 = scale_expansion_zeroelim(4,&local_8118,dVar48,local_76b8);
  iVar9 = fast_expansion_sum_zeroelim(iVar10,local_76b8,iVar9,local_75b8,local_7cf8);
  iVar10 = scale_expansion_zeroelim(4,&local_8198,dVar44,local_76b8);
  iVar11 = scale_expansion_zeroelim(4,&local_81d8,dVar1,local_76f8);
  iVar10 = fast_expansion_sum_zeroelim(iVar10,local_76b8,iVar11,local_76f8,local_75b8);
  iVar11 = scale_expansion_zeroelim(4,&local_8138,dVar36,local_76b8);
  iVar10 = fast_expansion_sum_zeroelim(iVar11,local_76b8,iVar10,local_75b8,local_7678);
  iVar11 = scale_expansion_zeroelim(4,&local_80f8,dVar1,local_76b8);
  iVar12 = scale_expansion_zeroelim(4,&local_81f8,dVar48,local_76f8);
  iVar11 = fast_expansion_sum_zeroelim(iVar11,local_76b8,iVar12,local_76f8,local_75b8);
  iVar12 = scale_expansion_zeroelim(4,&local_8158,dVar32,local_76b8);
  iVar11 = fast_expansion_sum_zeroelim(iVar12,local_76b8,iVar11,local_75b8,local_7db8);
  iVar12 = fast_expansion_sum_zeroelim(iVar4,local_7938,iVar8,local_7c38,local_7f38);
  uVar13 = fast_expansion_sum_zeroelim(iVar10,local_7678,iVar3,local_7878,local_80b8);
  if (0 < (int)uVar13) {
    uVar14 = 0;
    do {
      local_80b8[uVar14] = -local_80b8[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
  iVar12 = fast_expansion_sum_zeroelim(iVar12,local_7f38,uVar13,local_80b8,local_5438);
  iVar12 = scale_expansion_zeroelim(iVar12,local_5438,aheight,local_6338);
  elen = fast_expansion_sum_zeroelim(iVar5,local_79f8,iVar9,local_7cf8,local_7f38);
  uVar13 = fast_expansion_sum_zeroelim(iVar11,local_7db8,iVar4,local_7938,local_80b8);
  if (0 < (int)uVar13) {
    uVar14 = 0;
    do {
      local_80b8[uVar14] = -local_80b8[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
  iVar4 = fast_expansion_sum_zeroelim(elen,local_7f38,uVar13,local_80b8,local_5738);
  iVar4 = scale_expansion_zeroelim(iVar4,local_5738,bheight,local_6938);
  iVar10 = fast_expansion_sum_zeroelim(iVar6,local_7ab8,iVar10,local_7678,local_7f38);
  uVar13 = fast_expansion_sum_zeroelim(iVar7,local_7b78,iVar5,local_79f8,local_80b8);
  if (0 < (int)uVar13) {
    uVar14 = 0;
    do {
      local_80b8[uVar14] = -local_80b8[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
  iVar5 = fast_expansion_sum_zeroelim(iVar10,local_7f38,uVar13,local_80b8,local_5a38);
  iVar5 = scale_expansion_zeroelim(iVar5,local_5a38,cheight,local_6f38);
  iVar10 = fast_expansion_sum_zeroelim(iVar2,local_77b8,iVar11,local_7db8,local_7f38);
  uVar13 = fast_expansion_sum_zeroelim(iVar8,local_7c38,iVar6,local_7ab8,local_80b8);
  if (0 < (int)uVar13) {
    uVar14 = 0;
    do {
      local_80b8[uVar14] = -local_80b8[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
  iVar6 = fast_expansion_sum_zeroelim(iVar10,local_7f38,uVar13,local_80b8,local_5d38);
  iVar6 = scale_expansion_zeroelim(iVar6,local_5d38,dheight,local_7538);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,local_7878,iVar7,local_7b78,local_7f38);
  uVar13 = fast_expansion_sum_zeroelim(iVar9,local_7cf8,iVar2,local_77b8,local_80b8);
  if (0 < (int)uVar13) {
    uVar14 = 0;
    do {
      local_80b8[uVar14] = -local_80b8[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar13 != uVar14);
  }
  iVar2 = fast_expansion_sum_zeroelim(iVar3,local_7f38,uVar13,local_80b8,local_5138);
  iVar2 = scale_expansion_zeroelim(iVar2,local_5138,eheight,local_4e38);
  iVar3 = fast_expansion_sum_zeroelim(iVar12,local_6338,iVar4,local_6938,local_3c38);
  iVar4 = fast_expansion_sum_zeroelim(iVar5,local_6f38,iVar6,local_7538,local_4838);
  iVar2 = fast_expansion_sum_zeroelim(iVar4,local_4838,iVar2,local_4e38,local_1238);
  iVar2 = fast_expansion_sum_zeroelim(iVar3,local_3c38,iVar2,local_1238,adStack_3040 + 1);
  return adStack_3040[iVar2];
}

Assistant:

REAL orient4dexact(REAL* pa, REAL* pb, REAL* pc, REAL* pd, REAL* pe,
                   REAL aheight, REAL bheight, REAL cheight, REAL dheight, 
                   REAL eheight)
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxey1, exay1;
  INEXACT REAL bxay1, cxby1, dxcy1, exdy1, axey1;
  INEXACT REAL axcy1, bxdy1, cxey1, dxay1, exby1;
  INEXACT REAL cxay1, dxby1, excy1, axdy1, bxey1;
  REAL axby0, bxcy0, cxdy0, dxey0, exay0;
  REAL bxay0, cxby0, dxcy0, exdy0, axey0;
  REAL axcy0, bxdy0, cxey0, dxay0, exby0;
  REAL cxay0, dxby0, excy0, axdy0, bxey0;
  REAL ab[4], bc[4], cd[4], de[4], ea[4];
  REAL ac[4], bd[4], ce[4], da[4], eb[4];
  REAL temp8a[8], temp8b[8], temp16[16];
  int temp8alen, temp8blen, temp16len;
  REAL abc[24], bcd[24], cde[24], dea[24], eab[24];
  REAL abd[24], bce[24], cda[24], deb[24], eac[24];
  int abclen, bcdlen, cdelen, dealen, eablen;
  int abdlen, bcelen, cdalen, deblen, eaclen;
  REAL temp48a[48], temp48b[48];
  int temp48alen, temp48blen;
  REAL abcd[96], bcde[96], cdea[96], deab[96], eabc[96];
  int abcdlen, bcdelen, cdealen, deablen, eabclen;
  REAL adet[192], bdet[192], cdet[192], ddet[192], edet[192];
  int alen, blen, clen, dlen, elen;
  REAL abdet[384], cddet[384], cdedet[576];
  int ablen, cdlen;
  REAL deter[960];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;


  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pe[1], dxey1, dxey0);
  Two_Product(pe[0], pd[1], exdy1, exdy0);
  Two_Two_Diff(dxey1, dxey0, exdy1, exdy0, de[3], de[2], de[1], de[0]);

  Two_Product(pe[0], pa[1], exay1, exay0);
  Two_Product(pa[0], pe[1], axey1, axey0);
  Two_Two_Diff(exay1, exay0, axey1, axey0, ea[3], ea[2], ea[1], ea[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  Two_Product(pc[0], pe[1], cxey1, cxey0);
  Two_Product(pe[0], pc[1], excy1, excy0);
  Two_Two_Diff(cxey1, cxey0, excy1, excy0, ce[3], ce[2], ce[1], ce[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pe[0], pb[1], exby1, exby0);
  Two_Product(pb[0], pe[1], bxey1, bxey0);
  Two_Two_Diff(exby1, exby0, bxey1, bxey0, eb[3], eb[2], eb[1], eb[0]);

  temp8alen = scale_expansion_zeroelim(4, bc, pa[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, -pb[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ab, pc[2], temp8a);
  abclen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       abc);

  temp8alen = scale_expansion_zeroelim(4, cd, pb[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, -pc[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, bc, pd[2], temp8a);
  bcdlen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       bcd);

  temp8alen = scale_expansion_zeroelim(4, de, pc[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ce, -pd[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, cd, pe[2], temp8a);
  cdelen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       cde);

  temp8alen = scale_expansion_zeroelim(4, ea, pd[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, da, -pe[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, de, pa[2], temp8a);
  dealen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       dea);

  temp8alen = scale_expansion_zeroelim(4, ab, pe[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, eb, -pa[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ea, pb[2], temp8a);
  eablen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       eab);

  temp8alen = scale_expansion_zeroelim(4, bd, pa[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, da, pb[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ab, pd[2], temp8a);
  abdlen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       abd);

  temp8alen = scale_expansion_zeroelim(4, ce, pb[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, eb, pc[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, bc, pe[2], temp8a);
  bcelen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       bce);

  temp8alen = scale_expansion_zeroelim(4, da, pc[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ac, pd[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, cd, pa[2], temp8a);
  cdalen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       cda);

  temp8alen = scale_expansion_zeroelim(4, eb, pd[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, bd, pe[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, de, pb[2], temp8a);
  deblen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       deb);

  temp8alen = scale_expansion_zeroelim(4, ac, pe[2], temp8a);
  temp8blen = scale_expansion_zeroelim(4, ce, pa[2], temp8b);
  temp16len = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp8blen, temp8b,
                                          temp16);
  temp8alen = scale_expansion_zeroelim(4, ea, pc[2], temp8a);
  eaclen = fast_expansion_sum_zeroelim(temp8alen, temp8a, temp16len, temp16,
                                       eac);

  temp48alen = fast_expansion_sum_zeroelim(cdelen, cde, bcelen, bce, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(deblen, deb, bcdlen, bcd, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  bcdelen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, bcde);
  alen = scale_expansion_zeroelim(bcdelen, bcde, aheight, adet);

  temp48alen = fast_expansion_sum_zeroelim(dealen, dea, cdalen, cda, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(eaclen, eac, cdelen, cde, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  cdealen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, cdea);
  blen = scale_expansion_zeroelim(cdealen, cdea, bheight, bdet);

  temp48alen = fast_expansion_sum_zeroelim(eablen, eab, deblen, deb, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(abdlen, abd, dealen, dea, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  deablen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, deab);
  clen = scale_expansion_zeroelim(deablen, deab, cheight, cdet);

  temp48alen = fast_expansion_sum_zeroelim(abclen, abc, eaclen, eac, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(bcelen, bce, eablen, eab, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  eabclen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, eabc);
  dlen = scale_expansion_zeroelim(eabclen, eabc, dheight, ddet);

  temp48alen = fast_expansion_sum_zeroelim(bcdlen, bcd, abdlen, abd, temp48a);
  temp48blen = fast_expansion_sum_zeroelim(cdalen, cda, abclen, abc, temp48b);
  for (i = 0; i < temp48blen; i++) {
    temp48b[i] = -temp48b[i];
  }
  abcdlen = fast_expansion_sum_zeroelim(temp48alen, temp48a,
                                        temp48blen, temp48b, abcd);
  elen = scale_expansion_zeroelim(abcdlen, abcd, eheight, edet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  cdelen = fast_expansion_sum_zeroelim(cdlen, cddet, elen, edet, cdedet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdelen, cdedet, deter);

  return deter[deterlen - 1];
}